

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O2

int gost_grasshopper_cipher_do_cbc(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  int iVar1;
  long lVar2;
  grasshopper_w128_t *y;
  ulong uVar3;
  grasshopper_w128_t *to;
  grasshopper_w128_t *currentInputBlock;
  grasshopper_w128_t *currentOutputBlock;
  bool bVar4;
  grasshopper_w128_t tmp;
  
  lVar2 = EVP_CIPHER_CTX_get_cipher_data();
  y = (grasshopper_w128_t *)EVP_CIPHER_CTX_iv_noconst(ctx);
  iVar1 = EVP_CIPHER_CTX_is_encrypting(ctx);
  uVar3 = inl >> 4;
  while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
    if (iVar1 == 0) {
      to = &tmp;
      grasshopper_copy128(to,(grasshopper_w128_t *)in);
      grasshopper_decrypt_block
                ((grasshopper_round_keys_t *)(lVar2 + 0xe8),(grasshopper_w128_t *)in,
                 (grasshopper_w128_t *)out,(grasshopper_w128_t *)(lVar2 + 0x188));
      grasshopper_append128((grasshopper_w128_t *)out,y);
    }
    else {
      grasshopper_append128(y,(grasshopper_w128_t *)in);
      grasshopper_encrypt_block
                ((grasshopper_round_keys_t *)(lVar2 + 0x48),y,(grasshopper_w128_t *)out,
                 (grasshopper_w128_t *)(lVar2 + 0x188));
      to = (grasshopper_w128_t *)out;
    }
    grasshopper_copy128(y,to);
    in = (uchar *)((long)in + 0x10);
    out = (uchar *)((long)out + 0x10);
  }
  return 1;
}

Assistant:

static int gost_grasshopper_cipher_do_cbc(EVP_CIPHER_CTX *ctx, unsigned char *out,
                                          const unsigned char *in, size_t inl)
{
    gost_grasshopper_cipher_ctx *c =
        (gost_grasshopper_cipher_ctx *) EVP_CIPHER_CTX_get_cipher_data(ctx);
    unsigned char *iv = EVP_CIPHER_CTX_iv_noconst(ctx);
    bool encrypting = (bool) EVP_CIPHER_CTX_encrypting(ctx);
    const unsigned char *current_in = in;
    unsigned char *current_out = out;
    size_t blocks = inl / GRASSHOPPER_BLOCK_SIZE;
    size_t i;
    grasshopper_w128_t *currentBlock;

    currentBlock = (grasshopper_w128_t *) iv;

    for (i = 0; i < blocks;
         i++, current_in += GRASSHOPPER_BLOCK_SIZE, current_out +=
         GRASSHOPPER_BLOCK_SIZE) {
        grasshopper_w128_t *currentInputBlock = (grasshopper_w128_t *) current_in;
        grasshopper_w128_t *currentOutputBlock = (grasshopper_w128_t *) current_out;
        if (encrypting) {
            grasshopper_append128(currentBlock, currentInputBlock);
            grasshopper_encrypt_block(&c->encrypt_round_keys, currentBlock,
                                      currentOutputBlock, &c->buffer);
            grasshopper_copy128(currentBlock, currentOutputBlock);
        } else {
            grasshopper_w128_t tmp;

            grasshopper_copy128(&tmp, currentInputBlock);
            grasshopper_decrypt_block(&c->decrypt_round_keys,
                                      currentInputBlock, currentOutputBlock,
                                      &c->buffer);
            grasshopper_append128(currentOutputBlock, currentBlock);
            grasshopper_copy128(currentBlock, &tmp);
        }
    }

    return 1;
}